

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkPrintNodes(Cba_Ntk_t *p,int Type)

{
  Cba_ObjType_t CVar1;
  int iVar2;
  int i;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint i_00;
  uint uVar6;
  char *pTypeNames [90];
  
  Cba_ManCreatePrimMap(pTypeNames);
  printf("Operation %s\n",pTypeNames[Type]);
  uVar6 = 0;
  for (i_00 = 1; (int)i_00 < (p->vObjType).nSize; i_00 = i_00 + 1) {
    CVar1 = Cba_ObjType(p,i_00);
    if (CVar1 != CBA_OBJ_NONE) {
      iVar2 = Cba_ObjFinFon(p,i_00,0);
      i = Cba_ObjFinFon(p,i_00,1);
      printf("%8d  :",(ulong)uVar6);
      printf("%8d  :  ",(ulong)i_00);
      uVar3 = Cba_ObjRangeSize(p,i_00);
      iVar4 = Cba_ObjSigned(p,i_00);
      pcVar5 = "s";
      if (iVar4 == 0) {
        pcVar5 = " ";
      }
      printf("%3d%s = ",(ulong)uVar3,pcVar5);
      iVar4 = Cba_ObjFinFon(p,i_00,0);
      uVar3 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = Cba_ObjSigned(p,iVar2);
      pcVar5 = "s";
      if (iVar4 == 0) {
        pcVar5 = " ";
      }
      printf("%3d%s  %s ",(ulong)uVar3,pcVar5,pTypeNames[Type]);
      iVar4 = Cba_ObjFinFon(p,i_00,1);
      uVar3 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = Cba_ObjSigned(p,i);
      pcVar5 = "s";
      if (iVar4 == 0) {
        pcVar5 = " ";
      }
      printf("%3d%s ",(ulong)uVar3,pcVar5);
      printf(" :    ");
      pcVar5 = Cba_ObjNameStr(p,i_00);
      printf("%-12s =  ",pcVar5);
      if (iVar2 < 0) {
        iVar2 = Cba_FonConst(iVar2);
        pcVar5 = Cba_NtkConst(p,iVar2);
      }
      else {
        pcVar5 = Cba_FonNameStr(p,iVar2);
      }
      printf("%-12s  %s  ",pcVar5,pTypeNames[Type]);
      if (i < 0) {
        iVar2 = Cba_FonConst(i);
        pcVar5 = Cba_NtkConst(p,iVar2);
      }
      else {
        pcVar5 = Cba_FonNameStr(p,i);
      }
      uVar6 = uVar6 + 1;
      printf("%-12s ",pcVar5);
      putchar(10);
    }
  }
  return;
}

Assistant:

void Cba_NtkPrintNodes( Cba_Ntk_t * p, int Type )
{
    int i, iFon0, iFon1, Counter = 0;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "Operation %s\n", pTypeNames[Type] );
    Cba_NtkForEachObj( p, i )
    {
        if ( (int)Type != Type )
            continue;
        iFon0 = Cba_ObjFinFon(p, i, 0);
        iFon1 = Cba_ObjFinFon(p, i, 1);

        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Cba_ObjRangeSize(p, i),                      Cba_ObjSigned(p, i) ? "s" : " " );
        printf( "%3d%s  %s ",  Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSigned(p, iFon0) ? "s" : " ", pTypeNames[Type] );
        printf( "%3d%s ",      Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)), Cba_ObjSigned(p, iFon1) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Cba_ObjNameStr(p, i) );
        printf( "%-12s  %s  ", Cba_FonIsConst(iFon0) ? Cba_NtkConst(p, Cba_FonConst(iFon0)) : Cba_FonNameStr(p, iFon0), pTypeNames[Type] );
        printf( "%-12s ",      Cba_FonIsConst(iFon1) ? Cba_NtkConst(p, Cba_FonConst(iFon1)) : Cba_FonNameStr(p, iFon1) );
        printf( "\n" );
    }
}